

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publication.h
# Opt level: O0

void __thiscall aeron::Publication::checkMaxMessageLength(Publication *this,index_t length)

{
  IllegalArgumentException *this_00;
  char *pcVar1;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  string local_c8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  index_t local_14;
  Publication *pPStack_10;
  index_t length_local;
  Publication *this_local;
  
  if (this->m_maxMessageLength < length) {
    local_14 = length;
    pPStack_10 = this;
    this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_98,this->m_maxMessageLength);
    std::operator+(&local_78,"encoded message exceeds maxMessageLength of ",&local_98);
    std::operator+(&local_58,&local_78,", length=");
    std::__cxx11::to_string(&local_c8,local_14);
    std::operator+(&local_38,&local_58,&local_c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_e8,
               "void aeron::Publication::checkMaxMessageLength(const util::index_t) const",&local_e9
              );
    pcVar1 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                               ,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O0/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/Publication.h"
                              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_110,pcVar1,&local_111);
    util::IllegalArgumentException::IllegalArgumentException
              (this_00,&local_38,&local_e8,&local_110,0x27c);
    __cxa_throw(this_00,&util::IllegalArgumentException::typeinfo,
                util::IllegalArgumentException::~IllegalArgumentException);
  }
  return;
}

Assistant:

inline void checkMaxMessageLength(const util::index_t length) const
    {
        if (length > m_maxMessageLength)
        {
            throw util::IllegalArgumentException(
                "encoded message exceeds maxMessageLength of " + std::to_string(m_maxMessageLength) +
                ", length=" + std::to_string(length), SOURCEINFO);
        }
    }